

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void * columnName(sqlite3_stmt *pStmt,int N,int useUtf16,int useType)

{
  ushort uVar1;
  long lVar2;
  void *pvVar3;
  
  uVar1 = *(ushort *)(pStmt + 0xc0);
  if ((uint)N < (uint)uVar1) {
    lVar2 = *(long *)pStmt;
    if (*(sqlite3_mutex **)(lVar2 + 0x18) != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexEnter)(*(sqlite3_mutex **)(lVar2 + 0x18));
    }
    pvVar3 = sqlite3ValueText((sqlite3_value *)
                              ((ulong)((uint)uVar1 * useType + N) * 0x38 + *(long *)(pStmt + 0x98)),
                              '\x02' - (useUtf16 == 0));
    if (*(char *)(lVar2 + 0x61) != '\0') {
      if (*(int *)(lVar2 + 0xc4) == 0) {
        *(undefined1 *)(lVar2 + 0x61) = 0;
        *(undefined4 *)(lVar2 + 0x160) = 0;
        *(int *)(lVar2 + 0x168) = *(int *)(lVar2 + 0x168) + -1;
      }
      pvVar3 = (void *)0x0;
    }
    if (*(sqlite3_mutex **)(lVar2 + 0x18) != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)(*(sqlite3_mutex **)(lVar2 + 0x18));
    }
  }
  else {
    pvVar3 = (void *)0x0;
  }
  return pvVar3;
}

Assistant:

static const void *columnName(
  sqlite3_stmt *pStmt,     /* The statement */
  int N,                   /* Which column to get the name for */
  int useUtf16,            /* True to return the name as UTF16 */
  int useType              /* What type of name */
){
  const void *ret;
  Vdbe *p;
  int n;
  sqlite3 *db;
#ifdef SQLITE_ENABLE_API_ARMOR
  if( pStmt==0 ){
    (void)SQLITE_MISUSE_BKPT;
    return 0;
  }
#endif
  ret = 0;
  p = (Vdbe *)pStmt;
  db = p->db;
  assert( db!=0 );
  n = sqlite3_column_count(pStmt);
  if( N<n && N>=0 ){
    N += useType*n;
    sqlite3_mutex_enter(db->mutex);
    assert( db->mallocFailed==0 );
#ifndef SQLITE_OMIT_UTF16
    if( useUtf16 ){
      ret = sqlite3_value_text16((sqlite3_value*)&p->aColName[N]);
    }else
#endif
    {
      ret = sqlite3_value_text((sqlite3_value*)&p->aColName[N]);
    }
    /* A malloc may have failed inside of the _text() call. If this
    ** is the case, clear the mallocFailed flag and return NULL.
    */
    if( db->mallocFailed ){
      sqlite3OomClear(db);
      ret = 0;
    }
    sqlite3_mutex_leave(db->mutex);
  }
  return ret;
}